

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  int _h;
  int iVar1;
  Mat *this_01;
  Mat *this_02;
  size_t sVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  int i_35;
  long lVar7;
  int x_29;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int x_2;
  int y_15;
  int iVar11;
  uint uVar12;
  void *pvVar13;
  ulong uVar14;
  int i_36;
  uint uVar15;
  long lVar16;
  void *pvVar17;
  int x_28;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  Mat local_80;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = this_01 + 1;
  this_02 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    uVar12 = this_01->w;
    uVar19 = this_01->h;
    uVar9 = uVar19 * uVar12;
    sVar2 = this_01->elemsize;
    uVar15 = this_01[1].w;
    uVar8 = this_01[1].h;
    uVar18 = this_01[1].c;
    uVar3 = (ulong)uVar18;
    iVar11 = this_01->dims;
    if (iVar11 == 1) {
      uVar19 = uVar8 * uVar15;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar15,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) + fVar21;
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) + fVar21;
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_00,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = *(float *)((long)pvVar5 + uVar3 * 4) + fVar21;
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          fVar21 = *this_01[1].data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) + fVar21;
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar13 + uVar10 * 4) + *(float *)((long)pvVar17 + uVar10 * 4);
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar17 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar20 * 4);
          for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar5 + uVar14 * 4) = *(float *)((long)pvVar13 + uVar14 * 4) + fVar21;
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar10 * 4);
          Mat::channel(&local_80,this_00,(int)uVar10);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar10);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar17 + uVar20 * 4) = *(float *)((long)pvVar5 + uVar20 * 4) + fVar21;
          }
        }
      }
    }
    else if (iVar11 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar10 = 0;
        if (0 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        uVar20 = 0;
        if (0 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar8 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar17 + uVar6 * 4) + fVar21
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            fVar21 = *this_01[1].data;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) + fVar21;
            }
          }
          else {
            pvVar17 = this_01->data;
            pvVar13 = this_01[1].data;
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            uVar10 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar10 = 0;
            }
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar20 * 4);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                *(float *)((long)pvVar5 + uVar14 * 4) =
                     *(float *)((long)pvVar17 + uVar14 * 4) + fVar21;
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar13 + uVar10 * 4) + *(float *)((long)pvVar17 + uVar10 * 4);
          }
        }
      }
    }
    else if (iVar11 == 3) {
      uVar15 = this_01->c;
      uVar3 = (ulong)uVar15;
      Mat::create(this_02,uVar12,uVar19,uVar15,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          fVar21 = *this_00->data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_01,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = *(float *)((long)pvVar5 + uVar3 * 4) + fVar21;
            }
          }
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar9 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar17 + uVar20 * 4) =
                   *(float *)((long)pvVar5 + uVar20 * 4) + fVar21;
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar20 = 0;
        if (0 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        if ((int)uVar15 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar19 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar17 + uVar6 * 4) + fVar21
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          Mat::channel(&local_80,this_01,uVar12);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,uVar12);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,uVar12);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar13 + uVar3 * 4) =
                 *(float *)((long)pvVar17 + uVar3 * 4) + *(float *)((long)pvVar5 + uVar3 * 4);
          }
        }
      }
    }
    break;
  case 1:
    uVar12 = this_01->w;
    uVar19 = this_01->h;
    uVar9 = uVar19 * uVar12;
    sVar2 = this_01->elemsize;
    uVar15 = this_01[1].w;
    uVar8 = this_01[1].h;
    uVar18 = this_01[1].c;
    uVar3 = (ulong)uVar18;
    iVar11 = this_01->dims;
    if (iVar11 == 1) {
      uVar19 = uVar8 * uVar15;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar15,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar21 - *(float *)((long)pvVar17 + uVar3 * 4);
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar21 - *(float *)((long)pvVar17 + uVar3 * 4);
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_00,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar21 - *(float *)((long)pvVar5 + uVar3 * 4);
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          fVar21 = *this_01[1].data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) - fVar21;
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar17 + uVar10 * 4) - *(float *)((long)pvVar13 + uVar10 * 4);
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar17 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar20 * 4);
          for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar5 + uVar14 * 4) = fVar21 - *(float *)((long)pvVar13 + uVar14 * 4);
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar10 * 4);
          Mat::channel(&local_80,this_00,(int)uVar10);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar10);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar17 + uVar20 * 4) = fVar21 - *(float *)((long)pvVar5 + uVar20 * 4);
          }
        }
      }
    }
    else if (iVar11 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar10 = 0;
        if (0 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        uVar20 = 0;
        if (0 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar8 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar21 - *(float *)((long)pvVar17 + uVar6 * 4)
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            fVar21 = *this_01[1].data;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) - fVar21;
            }
          }
          else {
            pvVar17 = this_01->data;
            pvVar13 = this_01[1].data;
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            uVar10 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar10 = 0;
            }
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar20 * 4);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                *(float *)((long)pvVar5 + uVar14 * 4) =
                     *(float *)((long)pvVar17 + uVar14 * 4) - fVar21;
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar17 + uVar10 * 4) - *(float *)((long)pvVar13 + uVar10 * 4);
          }
        }
      }
    }
    else if (iVar11 == 3) {
      uVar15 = this_01->c;
      uVar3 = (ulong)uVar15;
      Mat::create(this_02,uVar12,uVar19,uVar15,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          fVar21 = *this_00->data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_01,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = *(float *)((long)pvVar5 + uVar3 * 4) - fVar21;
            }
          }
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar9 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar17 + uVar20 * 4) =
                   *(float *)((long)pvVar5 + uVar20 * 4) - fVar21;
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar20 = 0;
        if (0 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        if ((int)uVar15 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar19 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar17 + uVar6 * 4) - fVar21
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          Mat::channel(&local_80,this_01,uVar12);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,uVar12);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,uVar12);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar13 + uVar3 * 4) =
                 *(float *)((long)pvVar5 + uVar3 * 4) - *(float *)((long)pvVar17 + uVar3 * 4);
          }
        }
      }
    }
    break;
  case 2:
    uVar12 = this_01->w;
    uVar19 = this_01->h;
    uVar9 = uVar19 * uVar12;
    sVar2 = this_01->elemsize;
    uVar15 = this_01[1].w;
    uVar8 = this_01[1].h;
    uVar18 = this_01[1].c;
    uVar3 = (ulong)uVar18;
    iVar11 = this_01->dims;
    if (iVar11 == 1) {
      uVar19 = uVar8 * uVar15;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar15,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) * fVar21;
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) * fVar21;
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_00,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = *(float *)((long)pvVar5 + uVar3 * 4) * fVar21;
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          fVar21 = *this_01[1].data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) * fVar21;
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar13 + uVar10 * 4) * *(float *)((long)pvVar17 + uVar10 * 4);
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar17 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar20 * 4);
          for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar5 + uVar14 * 4) = *(float *)((long)pvVar13 + uVar14 * 4) * fVar21;
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar10 * 4);
          Mat::channel(&local_80,this_00,(int)uVar10);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar10);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar17 + uVar20 * 4) = *(float *)((long)pvVar5 + uVar20 * 4) * fVar21;
          }
        }
      }
    }
    else if (iVar11 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar10 = 0;
        if (0 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        uVar20 = 0;
        if (0 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar8 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar17 + uVar6 * 4) * fVar21
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            fVar21 = *this_01[1].data;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) * fVar21;
            }
          }
          else {
            pvVar17 = this_01->data;
            pvVar13 = this_01[1].data;
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            uVar10 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar10 = 0;
            }
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar20 * 4);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                *(float *)((long)pvVar5 + uVar14 * 4) =
                     *(float *)((long)pvVar17 + uVar14 * 4) * fVar21;
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar13 + uVar10 * 4) * *(float *)((long)pvVar17 + uVar10 * 4);
          }
        }
      }
    }
    else if (iVar11 == 3) {
      uVar15 = this_01->c;
      uVar3 = (ulong)uVar15;
      Mat::create(this_02,uVar12,uVar19,uVar15,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          fVar21 = *this_00->data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_01,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = *(float *)((long)pvVar5 + uVar3 * 4) * fVar21;
            }
          }
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar9 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar17 + uVar20 * 4) =
                   *(float *)((long)pvVar5 + uVar20 * 4) * fVar21;
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar20 = 0;
        if (0 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        if ((int)uVar15 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar19 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar17 + uVar6 * 4) * fVar21
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          Mat::channel(&local_80,this_01,uVar12);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,uVar12);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,uVar12);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar13 + uVar3 * 4) =
                 *(float *)((long)pvVar17 + uVar3 * 4) * *(float *)((long)pvVar5 + uVar3 * 4);
          }
        }
      }
    }
    break;
  case 3:
    uVar12 = this_01->w;
    uVar19 = this_01->h;
    uVar9 = uVar19 * uVar12;
    sVar2 = this_01->elemsize;
    uVar15 = this_01[1].w;
    uVar8 = this_01[1].h;
    uVar18 = this_01[1].c;
    uVar3 = (ulong)uVar18;
    iVar11 = this_01->dims;
    if (iVar11 == 1) {
      uVar19 = uVar8 * uVar15;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar15,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar21 / *(float *)((long)pvVar17 + uVar3 * 4);
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar21 / *(float *)((long)pvVar17 + uVar3 * 4);
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_00,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar21 / *(float *)((long)pvVar5 + uVar3 * 4);
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          fVar21 = *this_01[1].data;
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar17 + uVar10 * 4) * (1.0 / fVar21);
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar17 + uVar10 * 4) / *(float *)((long)pvVar13 + uVar10 * 4);
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar17 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar20 * 4);
          for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar5 + uVar14 * 4) = fVar21 / *(float *)((long)pvVar13 + uVar14 * 4);
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar10 * 4);
          Mat::channel(&local_80,this_00,(int)uVar10);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar10);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar17 + uVar20 * 4) = fVar21 / *(float *)((long)pvVar5 + uVar20 * 4);
          }
        }
      }
    }
    else if (iVar11 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar10 = 0;
        if (0 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        uVar20 = 0;
        if (0 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar8 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar21 / *(float *)((long)pvVar17 + uVar6 * 4)
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            uVar3 = (ulong)uVar9;
            if ((int)uVar9 < 1) {
              uVar3 = 0;
            }
            fVar21 = *this_01[1].data;
            for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
              *(float *)((long)pvVar5 + uVar10 * 4) =
                   *(float *)((long)pvVar17 + uVar10 * 4) * (1.0 / fVar21);
            }
          }
          else {
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            pvVar17 = this_01->data;
            uVar10 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar10 = 0;
            }
            pvVar13 = this_01[1].data;
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar20 * 4);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                *(float *)((long)pvVar5 + uVar14 * 4) =
                     *(float *)((long)pvVar17 + uVar14 * 4) * (1.0 / fVar21);
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar17 + uVar10 * 4) / *(float *)((long)pvVar13 + uVar10 * 4);
          }
        }
      }
    }
    else if (iVar11 == 3) {
      uVar15 = this_01->c;
      uVar3 = (ulong)uVar15;
      Mat::create(this_02,uVar12,uVar19,uVar15,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          fVar21 = *this_00->data;
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_01,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) =
                   *(float *)((long)pvVar5 + uVar3 * 4) * (1.0 / fVar21);
            }
          }
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar9 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar17 + uVar20 * 4) =
                   *(float *)((long)pvVar5 + uVar20 * 4) * (1.0 / fVar21);
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar20 = 0;
        if (0 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        if ((int)uVar15 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar19 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) =
                   *(float *)((long)pvVar17 + uVar6 * 4) * (1.0 / fVar21);
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          Mat::channel(&local_80,this_01,uVar12);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,uVar12);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,uVar12);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar13 + uVar3 * 4) =
                 *(float *)((long)pvVar5 + uVar3 * 4) / *(float *)((long)pvVar17 + uVar3 * 4);
          }
        }
      }
    }
    break;
  case 4:
    uVar12 = this_01->w;
    uVar19 = this_01->h;
    uVar9 = uVar19 * uVar12;
    sVar2 = this_01->elemsize;
    uVar15 = this_01[1].w;
    uVar8 = this_01[1].h;
    uVar18 = this_01[1].c;
    uVar3 = (ulong)uVar18;
    iVar11 = this_01->dims;
    if (iVar11 == 1) {
      uVar19 = uVar8 * uVar15;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar15,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            fVar22 = *(float *)((long)pvVar17 + uVar3 * 4);
            if (fVar22 <= fVar21) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            fVar22 = *(float *)((long)pvVar17 + uVar3 * 4);
            if (fVar22 <= fVar21) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_00,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
              fVar22 = *(float *)((long)pvVar5 + uVar3 * 4);
              if (fVar22 <= fVar21) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          fVar21 = *this_01[1].data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            fVar22 = *(float *)((long)pvVar17 + uVar3 * 4);
            if (fVar22 <= fVar21) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = *(float *)((long)pvVar13 + uVar10 * 4);
            fVar22 = *(float *)((long)pvVar17 + uVar10 * 4);
            if (fVar21 <= fVar22) {
              fVar21 = fVar22;
            }
            *(float *)((long)pvVar5 + uVar10 * 4) = fVar21;
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar17 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar20 * 4);
          for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
            fVar22 = *(float *)((long)pvVar13 + uVar14 * 4);
            if (fVar22 <= fVar21) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar5 + uVar14 * 4) = fVar22;
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar10 * 4);
          Mat::channel(&local_80,this_00,(int)uVar10);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar10);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = *(float *)((long)pvVar5 + uVar20 * 4);
            if (fVar22 <= fVar21) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar17 + uVar20 * 4) = fVar22;
          }
        }
      }
    }
    else if (iVar11 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar10 = 0;
        if (0 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        uVar20 = 0;
        if (0 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar8 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar17 + uVar6 * 4);
              if (fVar22 <= fVar21) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar22;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            fVar21 = *this_01[1].data;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              fVar22 = *(float *)((long)pvVar17 + uVar3 * 4);
              if (fVar22 <= fVar21) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
            }
          }
          else {
            pvVar17 = this_01->data;
            pvVar13 = this_01[1].data;
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            uVar10 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar10 = 0;
            }
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar20 * 4);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                fVar22 = *(float *)((long)pvVar17 + uVar14 * 4);
                if (fVar22 <= fVar21) {
                  fVar22 = fVar21;
                }
                *(float *)((long)pvVar5 + uVar14 * 4) = fVar22;
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = *(float *)((long)pvVar13 + uVar10 * 4);
            fVar22 = *(float *)((long)pvVar17 + uVar10 * 4);
            if (fVar21 <= fVar22) {
              fVar21 = fVar22;
            }
            *(float *)((long)pvVar5 + uVar10 * 4) = fVar21;
          }
        }
      }
    }
    else if (iVar11 == 3) {
      uVar15 = this_01->c;
      uVar3 = (ulong)uVar15;
      Mat::create(this_02,uVar12,uVar19,uVar15,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          fVar21 = *this_00->data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_01,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              fVar22 = *(float *)((long)pvVar5 + uVar3 * 4);
              if (fVar22 <= fVar21) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar22;
            }
          }
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar9 != uVar20; uVar20 = uVar20 + 1) {
              fVar22 = *(float *)((long)pvVar5 + uVar20 * 4);
              if (fVar22 <= fVar21) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar17 + uVar20 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar20 = 0;
        if (0 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        if ((int)uVar15 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar19 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar17 + uVar6 * 4);
              if (fVar22 <= fVar21) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar22;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          Mat::channel(&local_80,this_01,uVar12);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,uVar12);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,uVar12);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            fVar21 = *(float *)((long)pvVar17 + uVar3 * 4);
            fVar22 = *(float *)((long)pvVar5 + uVar3 * 4);
            if (fVar21 <= fVar22) {
              fVar21 = fVar22;
            }
            *(float *)((long)pvVar13 + uVar3 * 4) = fVar21;
          }
        }
      }
    }
    break;
  case 5:
    uVar12 = this_01->w;
    uVar19 = this_01->h;
    uVar9 = uVar19 * uVar12;
    sVar2 = this_01->elemsize;
    uVar15 = this_01[1].w;
    uVar8 = this_01[1].h;
    uVar18 = this_01[1].c;
    uVar3 = (ulong)uVar18;
    iVar11 = this_01->dims;
    if (iVar11 == 1) {
      uVar19 = uVar8 * uVar15;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar15,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            fVar22 = *(float *)((long)pvVar17 + uVar3 * 4);
            if (fVar21 <= fVar22) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            fVar22 = *(float *)((long)pvVar17 + uVar3 * 4);
            if (fVar21 <= fVar22) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_00,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
              fVar22 = *(float *)((long)pvVar5 + uVar3 * 4);
              if (fVar21 <= fVar22) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          fVar21 = *this_01[1].data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            fVar22 = *(float *)((long)pvVar17 + uVar3 * 4);
            if (fVar21 <= fVar22) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = *(float *)((long)pvVar13 + uVar10 * 4);
            fVar22 = *(float *)((long)pvVar17 + uVar10 * 4);
            if (fVar22 <= fVar21) {
              fVar21 = fVar22;
            }
            *(float *)((long)pvVar5 + uVar10 * 4) = fVar21;
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar17 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar20 * 4);
          for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
            fVar22 = *(float *)((long)pvVar13 + uVar14 * 4);
            if (fVar21 <= fVar22) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar5 + uVar14 * 4) = fVar22;
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar10 * 4);
          Mat::channel(&local_80,this_00,(int)uVar10);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar10);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = *(float *)((long)pvVar5 + uVar20 * 4);
            if (fVar21 <= fVar22) {
              fVar22 = fVar21;
            }
            *(float *)((long)pvVar17 + uVar20 * 4) = fVar22;
          }
        }
      }
    }
    else if (iVar11 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar10 = 0;
        if (0 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        uVar20 = 0;
        if (0 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar8 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar17 + uVar6 * 4);
              if (fVar21 <= fVar22) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar22;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            fVar21 = *this_01[1].data;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              fVar22 = *(float *)((long)pvVar17 + uVar3 * 4);
              if (fVar21 <= fVar22) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
            }
          }
          else {
            pvVar17 = this_01->data;
            pvVar13 = this_01[1].data;
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            uVar10 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar10 = 0;
            }
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar20 * 4);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                fVar22 = *(float *)((long)pvVar17 + uVar14 * 4);
                if (fVar21 <= fVar22) {
                  fVar22 = fVar21;
                }
                *(float *)((long)pvVar5 + uVar14 * 4) = fVar22;
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = *(float *)((long)pvVar13 + uVar10 * 4);
            fVar22 = *(float *)((long)pvVar17 + uVar10 * 4);
            if (fVar22 <= fVar21) {
              fVar21 = fVar22;
            }
            *(float *)((long)pvVar5 + uVar10 * 4) = fVar21;
          }
        }
      }
    }
    else if (iVar11 == 3) {
      uVar15 = this_01->c;
      uVar3 = (ulong)uVar15;
      Mat::create(this_02,uVar12,uVar19,uVar15,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          fVar21 = *this_00->data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_01,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              fVar22 = *(float *)((long)pvVar5 + uVar3 * 4);
              if (fVar21 <= fVar22) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar22;
            }
          }
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar9 != uVar20; uVar20 = uVar20 + 1) {
              fVar22 = *(float *)((long)pvVar5 + uVar20 * 4);
              if (fVar21 <= fVar22) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar17 + uVar20 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar20 = 0;
        if (0 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        if ((int)uVar15 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar19 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar17 + uVar6 * 4);
              if (fVar21 <= fVar22) {
                fVar22 = fVar21;
              }
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar22;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          Mat::channel(&local_80,this_01,uVar12);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,uVar12);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,uVar12);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            fVar21 = *(float *)((long)pvVar17 + uVar3 * 4);
            fVar22 = *(float *)((long)pvVar5 + uVar3 * 4);
            if (fVar22 <= fVar21) {
              fVar21 = fVar22;
            }
            *(float *)((long)pvVar13 + uVar3 * 4) = fVar21;
          }
        }
      }
    }
    break;
  case 6:
    uVar12 = this_01->w;
    iVar11 = this_01->h;
    local_38 = (ulong)iVar11;
    uVar8 = iVar11 * uVar12;
    uVar3 = (ulong)uVar8;
    sVar2 = this_01->elemsize;
    uVar19 = this_01[1].w;
    _h = this_01[1].h;
    local_40 = (ulong)_h;
    uVar15 = this_01[1].c;
    local_48 = (ulong)uVar15;
    iVar1 = this_01->dims;
    if (iVar1 == 1) {
      uVar18 = _h * uVar19;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar3 = 0; uVar18 != uVar3; uVar3 = uVar3 + 1) {
            fVar22 = powf(fVar21,*(float *)((long)pvVar17 + uVar3 * 4));
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar19,_h,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar3 = 0; uVar18 != uVar3; uVar3 = uVar3 + 1) {
            fVar22 = powf(fVar21,*(float *)((long)pvVar17 + uVar3 * 4));
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar22;
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar19,_h,uVar15,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar21 = *this_01->data;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          iVar11 = (int)local_48;
          local_48 = local_48 & 0xffffffff;
          if (iVar11 < 1) {
            local_48 = 0;
          }
          for (iVar11 = 0; iVar11 != (int)local_48; iVar11 = iVar11 + 1) {
            Mat::channel(&local_80,this_00,iVar11);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,iVar11);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar18 != uVar3; uVar3 = uVar3 + 1) {
              fVar22 = powf(fVar21,*(float *)((long)pvVar5 + uVar3 * 4));
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          fVar21 = *this_01[1].data;
          if ((int)uVar8 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            fVar22 = powf(*(float *)((long)pvVar17 + uVar10 * 4),fVar21);
            *(float *)((long)pvVar5 + uVar10 * 4) = fVar22;
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          if ((int)uVar8 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = powf(*(float *)((long)pvVar17 + uVar10 * 4),
                          *(float *)((long)pvVar13 + uVar10 * 4));
            *(float *)((long)pvVar5 + uVar10 * 4) = fVar21;
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar19,_h,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar17 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar3 = 0;
        if (0 < (int)uVar19) {
          uVar3 = (ulong)uVar19;
        }
        iVar11 = (int)local_40;
        local_40 = local_40 & 0xffffffff;
        if (iVar11 < 1) {
          local_40 = 0;
        }
        lVar7 = (long)(int)uVar19 * 4;
        for (uVar10 = 0; uVar10 != local_40; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar10 * 4);
          for (uVar20 = 0; uVar3 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = powf(fVar21,*(float *)((long)pvVar13 + uVar20 * 4));
            *(float *)((long)pvVar5 + uVar20 * 4) = fVar22;
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar19,_h,uVar15,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        iVar11 = (int)local_48;
        local_48 = local_48 & 0xffffffff;
        if (iVar11 < 1) {
          local_48 = 0;
        }
        for (uVar3 = 0; uVar3 != local_48; uVar3 = uVar3 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar3 * 4);
          Mat::channel(&local_80,this_00,(int)uVar3);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar3);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar10 = 0; uVar18 != uVar10; uVar10 = uVar10 + 1) {
            fVar22 = powf(fVar21,*(float *)((long)pvVar5 + uVar10 * 4));
            *(float *)((long)pvVar17 + uVar10 * 4) = fVar22;
          }
        }
      }
    }
    else if (iVar1 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar19,_h,uVar15,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar3 = 0;
        if (0 < (int)uVar19) {
          uVar3 = (ulong)uVar19;
        }
        uVar10 = 0;
        if (0 < (int)local_40) {
          uVar10 = local_40 & 0xffffffff;
        }
        iVar11 = (int)local_48;
        local_48 = local_48 & 0xffffffff;
        if (iVar11 < 1) {
          local_48 = 0;
        }
        lVar7 = (long)(int)uVar19 * 4;
        uVar20 = 0;
        while (uVar20 != local_48) {
          lVar16 = uVar20 * local_40;
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar20);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          local_38 = uVar20;
          Mat::channel(&local_80,this_02,(int)uVar20);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar20 * 4 + lVar16 * 4);
            for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
              fVar22 = powf(fVar21,*(float *)((long)pvVar17 + uVar14 * 4));
              *(float *)((long)pvVar13 + uVar14 * 4) = fVar22;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
          uVar20 = local_38 + 1;
        }
      }
      else {
        Mat::create(this_02,uVar12,iVar11,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,(int)local_38,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            fVar21 = *this_01[1].data;
            if ((int)uVar8 < 1) {
              uVar3 = 0;
            }
            for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
              fVar22 = powf(*(float *)((long)pvVar17 + uVar10 * 4),fVar21);
              *(float *)((long)pvVar5 + uVar10 * 4) = fVar22;
            }
          }
          else {
            pvVar17 = this_01->data;
            pvVar13 = this_01[1].data;
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            iVar11 = (int)local_38;
            local_38 = local_38 & 0xffffffff;
            if (iVar11 < 1) {
              local_38 = 0;
            }
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar10 * 4);
              for (uVar20 = 0; uVar3 != uVar20; uVar20 = uVar20 + 1) {
                fVar22 = powf(*(float *)((long)pvVar17 + uVar20 * 4),fVar21);
                *(float *)((long)pvVar5 + uVar20 * 4) = fVar22;
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          if ((int)uVar8 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = powf(*(float *)((long)pvVar17 + uVar10 * 4),
                          *(float *)((long)pvVar13 + uVar10 * 4));
            *(float *)((long)pvVar5 + uVar10 * 4) = fVar21;
          }
        }
      }
    }
    else if (iVar1 == 3) {
      uVar19 = this_01->c;
      Mat::create(this_02,uVar12,iVar11,uVar19,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          fVar21 = *this_00->data;
          if ((int)uVar8 < 1) {
            uVar3 = 0;
          }
          local_48 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            local_48 = 0;
          }
          for (iVar11 = 0; iVar11 != (int)local_48; iVar11 = iVar11 + 1) {
            Mat::channel(&local_80,this_01,iVar11);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,iVar11);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
              fVar22 = powf(*(float *)((long)pvVar5 + uVar10 * 4),fVar21);
              *(float *)((long)pvVar17 + uVar10 * 4) = fVar22;
            }
          }
        }
        else {
          if ((int)uVar8 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          local_48 = (ulong)uVar19;
          for (uVar10 = 0; uVar10 != local_48; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar3 != uVar20; uVar20 = uVar20 + 1) {
              fVar22 = powf(*(float *)((long)pvVar5 + uVar20 * 4),fVar21);
              *(float *)((long)pvVar17 + uVar20 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar3 = 0;
        if (0 < (int)uVar12) {
          uVar3 = (ulong)uVar12;
        }
        uVar10 = 0;
        if (0 < (int)local_38) {
          uVar10 = local_38 & 0xffffffff;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        local_48 = (ulong)uVar19;
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar20 = 0; uVar20 != local_48; uVar20 = uVar20 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar20);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          lVar16 = uVar20 * local_38;
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar20);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar14 = 0; uVar14 != uVar10; uVar14 = uVar14 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar14 * 4 + lVar16 * 4);
            for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
              fVar22 = powf(*(float *)((long)pvVar17 + uVar4 * 4),fVar21);
              *(float *)((long)pvVar13 + uVar4 * 4) = fVar22;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar8 < 1) {
          uVar3 = 0;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        local_48 = (ulong)uVar19;
        for (iVar11 = 0; iVar11 != (int)local_48; iVar11 = iVar11 + 1) {
          Mat::channel(&local_80,this_01,iVar11);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,iVar11);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,iVar11);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = powf(*(float *)((long)pvVar5 + uVar10 * 4),
                          *(float *)((long)pvVar17 + uVar10 * 4));
            *(float *)((long)pvVar13 + uVar10 * 4) = fVar21;
          }
        }
      }
    }
    break;
  case 7:
    uVar12 = this_01->w;
    uVar19 = this_01->h;
    uVar9 = uVar19 * uVar12;
    sVar2 = this_01->elemsize;
    uVar15 = this_01[1].w;
    uVar8 = this_01[1].h;
    uVar18 = this_01[1].c;
    uVar3 = (ulong)uVar18;
    iVar11 = this_01->dims;
    if (iVar11 == 1) {
      uVar19 = uVar8 * uVar15;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar15,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) - fVar21;
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = *(float *)((long)pvVar17 + uVar3 * 4) - fVar21;
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar21 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_00,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = *(float *)((long)pvVar5 + uVar3 * 4) - fVar21;
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          fVar21 = *this_01[1].data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar21 - *(float *)((long)pvVar17 + uVar3 * 4);
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar13 + uVar10 * 4) - *(float *)((long)pvVar17 + uVar10 * 4);
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar17 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar20 * 4);
          for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar5 + uVar14 * 4) = *(float *)((long)pvVar13 + uVar14 * 4) - fVar21;
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar10 * 4);
          Mat::channel(&local_80,this_00,(int)uVar10);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar10);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar17 + uVar20 * 4) = *(float *)((long)pvVar5 + uVar20 * 4) - fVar21;
          }
        }
      }
    }
    else if (iVar11 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar10 = 0;
        if (0 < (int)uVar15) {
          uVar10 = (ulong)uVar15;
        }
        uVar20 = 0;
        if (0 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar8 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = *(float *)((long)pvVar17 + uVar6 * 4) - fVar21
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            fVar21 = *this_01[1].data;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar5 + uVar3 * 4) = fVar21 - *(float *)((long)pvVar17 + uVar3 * 4);
            }
          }
          else {
            pvVar17 = this_01->data;
            pvVar13 = this_01[1].data;
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            uVar10 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar10 = 0;
            }
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar20 * 4);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                *(float *)((long)pvVar5 + uVar14 * 4) =
                     fVar21 - *(float *)((long)pvVar17 + uVar14 * 4);
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar13 + uVar10 * 4) - *(float *)((long)pvVar17 + uVar10 * 4);
          }
        }
      }
    }
    else if (iVar11 == 3) {
      uVar15 = this_01->c;
      uVar3 = (ulong)uVar15;
      Mat::create(this_02,uVar12,uVar19,uVar15,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          fVar21 = *this_00->data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_01,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar21 - *(float *)((long)pvVar5 + uVar3 * 4);
            }
          }
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar9 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar17 + uVar20 * 4) =
                   fVar21 - *(float *)((long)pvVar5 + uVar20 * 4);
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar20 = 0;
        if (0 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        if ((int)uVar15 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar19 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar21 - *(float *)((long)pvVar17 + uVar6 * 4)
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          Mat::channel(&local_80,this_01,uVar12);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,uVar12);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,uVar12);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar13 + uVar3 * 4) =
                 *(float *)((long)pvVar17 + uVar3 * 4) - *(float *)((long)pvVar5 + uVar3 * 4);
          }
        }
      }
    }
    break;
  case 8:
    uVar12 = this_01->w;
    uVar19 = this_01->h;
    uVar9 = uVar19 * uVar12;
    sVar2 = this_01->elemsize;
    uVar15 = this_01[1].w;
    uVar8 = this_01[1].h;
    uVar18 = this_01[1].c;
    iVar11 = this_01->dims;
    if (iVar11 == 1) {
      uVar19 = uVar8 * uVar15;
      iVar11 = this_01[1].dims;
      if (uVar12 == 1) {
        if (iVar11 == 1) {
          Mat::create(this_02,uVar15,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          fVar21 = *this_01->data;
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) =
                 *(float *)((long)pvVar17 + uVar3 * 4) * (1.0 / fVar21);
          }
        }
        else if (iVar11 == 2) {
          Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar17 = this_01[1].data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          fVar21 = *this_01->data;
          for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) =
                 *(float *)((long)pvVar17 + uVar3 * 4) * (1.0 / fVar21);
          }
        }
        else {
          if (iVar11 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          fVar21 = *this_01->data;
          for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_00,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar19 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) =
                   *(float *)((long)pvVar5 + uVar3 * 4) * (1.0 / fVar21);
            }
          }
        }
      }
      else if (iVar11 == 1) {
        Mat::create(this_02,uVar12,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar17 = this_01->data;
          fVar21 = *this_01[1].data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar5 + uVar3 * 4) = fVar21 / *(float *)((long)pvVar17 + uVar3 * 4);
          }
        }
        else {
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar13 + uVar10 * 4) / *(float *)((long)pvVar17 + uVar10 * 4);
          }
        }
      }
      else if (iVar11 == 2) {
        Mat::create(this_02,uVar15,uVar8,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        pvVar17 = this_01->data;
        uVar10 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar10 = 0;
        }
        pvVar13 = this_01[1].data;
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
          fVar21 = *(float *)((long)pvVar17 + uVar20 * 4);
          for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar5 + uVar14 * 4) =
                 *(float *)((long)pvVar13 + uVar14 * 4) * (1.0 / fVar21);
          }
          pvVar5 = (void *)((long)pvVar5 + lVar7);
          pvVar13 = (void *)((long)pvVar13 + lVar7);
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        uVar3 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar3 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
          fVar21 = *(float *)((long)this_01->data + uVar10 * 4);
          Mat::channel(&local_80,this_00,(int)uVar10);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar10);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar17 + uVar20 * 4) =
                 *(float *)((long)pvVar5 + uVar20 * 4) * (1.0 / fVar21);
          }
        }
      }
    }
    else if (iVar11 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar15,uVar8,uVar18,sVar2,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar3 = 0;
        if (0 < (int)uVar15) {
          uVar3 = (ulong)uVar15;
        }
        uVar10 = 0;
        if (0 < (int)uVar8) {
          uVar10 = (ulong)uVar8;
        }
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        lVar7 = (long)(int)uVar15 * 4;
        for (uVar20 = 0; uVar20 != uVar18; uVar20 = uVar20 + 1) {
          pvVar5 = this_01->data;
          Mat::channel(&local_80,this_00,(int)uVar20);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,(int)uVar20);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar14 = 0; uVar14 != uVar10; uVar14 = uVar14 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar14 * 4 + uVar20 * (long)(int)uVar8 * 4);
            for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
              *(float *)((long)pvVar13 + uVar4 * 4) =
                   *(float *)((long)pvVar17 + uVar4 * 4) * (1.0 / fVar21);
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
        pvVar5 = this_02->data;
        if ((pvVar5 == (void *)0x0) || ((long)this_02->c * this_02->cstep == 0)) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          Mat::create(this_02,uVar12,uVar19,sVar2,opt->blob_allocator);
          pvVar5 = this_02->data;
          if (pvVar5 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar17 = this_01->data;
            fVar21 = *this_01[1].data;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar5 + uVar3 * 4) = fVar21 / *(float *)((long)pvVar17 + uVar3 * 4);
            }
          }
          else {
            pvVar17 = this_01->data;
            pvVar13 = this_01[1].data;
            uVar3 = 0;
            if (0 < (int)uVar12) {
              uVar3 = (ulong)uVar12;
            }
            uVar10 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar10 = 0;
            }
            lVar7 = (long)(int)uVar12 * 4;
            for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
              fVar21 = *(float *)((long)pvVar13 + uVar20 * 4);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                *(float *)((long)pvVar5 + uVar14 * 4) =
                     fVar21 / *(float *)((long)pvVar17 + uVar14 * 4);
              }
              pvVar5 = (void *)((long)pvVar5 + lVar7);
              pvVar17 = (void *)((long)pvVar17 + lVar7);
            }
          }
        }
        else {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar17 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar3 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar5 + uVar10 * 4) =
                 *(float *)((long)pvVar13 + uVar10 * 4) / *(float *)((long)pvVar17 + uVar10 * 4);
          }
        }
      }
    }
    else if (iVar11 == 3) {
      uVar15 = this_01->c;
      uVar3 = (ulong)uVar15;
      Mat::create(this_02,uVar12,uVar19,uVar15,sVar2,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      iVar11 = this_01[1].dims;
      if (iVar11 == 1) {
        if (this_01[1].w == 1) {
          fVar21 = *this_00->data;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            Mat::channel(&local_80,this_01,uVar12);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,this_02,uVar12);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
              *(float *)((long)pvVar17 + uVar3 * 4) = fVar21 / *(float *)((long)pvVar5 + uVar3 * 4);
            }
          }
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar3 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            Mat::channel(&local_80,this_01,(int)uVar10);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            fVar21 = *(float *)((long)this_01[1].data + uVar10 * 4);
            Mat::channel(&local_80,this_02,(int)uVar10);
            pvVar17 = local_80.data;
            Mat::~Mat(&local_80);
            for (uVar20 = 0; uVar9 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar17 + uVar20 * 4) =
                   fVar21 / *(float *)((long)pvVar5 + uVar20 * 4);
            }
          }
        }
      }
      else if (iVar11 == 2) {
        uVar10 = 0;
        if (0 < (int)uVar12) {
          uVar10 = (ulong)uVar12;
        }
        uVar20 = 0;
        if (0 < (int)uVar19) {
          uVar20 = (ulong)uVar19;
        }
        if ((int)uVar15 < 1) {
          uVar3 = 0;
        }
        lVar7 = (long)(int)uVar12 * 4;
        for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
          Mat::channel(&local_80,this_01,(int)uVar14);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar5 = this_01[1].data;
          Mat::channel(&local_80,this_02,(int)uVar14);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            fVar21 = *(float *)((long)pvVar5 + uVar4 * 4 + uVar14 * (long)(int)uVar19 * 4);
            for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar13 + uVar6 * 4) = fVar21 / *(float *)((long)pvVar17 + uVar6 * 4)
              ;
            }
            pvVar13 = (void *)((long)pvVar13 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
      }
      else {
        if (iVar11 != 3) {
          return 0;
        }
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          Mat::channel(&local_80,this_01,uVar12);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_00,uVar12);
          pvVar17 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,this_02,uVar12);
          pvVar13 = local_80.data;
          Mat::~Mat(&local_80);
          for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar13 + uVar3 * 4) =
                 *(float *)((long)pvVar17 + uVar3 * 4) / *(float *)((long)pvVar5 + uVar3 * 4);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op< std::plus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op< std::minus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op< std::multiplies<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op< std::divides<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op< binary_op_max<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op< binary_op_min<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op< binary_op_pow<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op< binary_op_rsub<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op< binary_op_rdiv<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}